

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::iterate(FunctionalTest *this)

{
  bool bVar1;
  bool bVar2;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  float fVar7;
  float local_4ec;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  char *local_1d8;
  GLchar *local_1d0;
  GLchar *local_1c8;
  MessageBuilder local_1c0;
  GLfloat local_40;
  float local_3c;
  GLfloat resulted_value;
  GLfloat expected_value;
  GLuint k;
  GLuint j;
  GLuint i;
  byte local_1f;
  byte local_1e;
  undefined1 local_1d;
  deUint32 local_1c;
  bool is_error;
  bool is_ok;
  ApiType AStack_18;
  bool is_arb_conditional_render_inverted;
  byte local_11;
  FunctionalTest *pFStack_10;
  bool is_at_least_gl_45;
  FunctionalTest *this_local;
  
  pFStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_18.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::core(4,5);
  local_11 = glu::contextSupports((ContextType)AStack_18.m_bits,(ApiType)local_1c);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_1d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_conditional_render_inverted");
  local_1e = 1;
  local_1f = 0;
  if (((local_11 & 1) != 0) || ((bool)local_1d)) {
    createProgram(this);
    createView(this);
    createVertexArrayObject(this);
    for (k = 0; k < 2; k = k + 1) {
      for (expected_value = 0.0; (uint)expected_value < 2;
          expected_value = (GLfloat)((int)expected_value + 1)) {
        for (resulted_value = 0.0; (uint)resulted_value < 4;
            resulted_value = (GLfloat)((int)resulted_value + 1)) {
          createQueryObject(this);
          setupColor(this,1.0);
          setupPassSwitch(this,(bool)(iterate::render_cases[k] & 1));
          clearView(this);
          draw(this,false,iterate::query_cases[(uint)expected_value]);
          bVar1 = iterate::render_cases[k];
          bVar2 = fragmentsPassed(this);
          if ((bool)(bVar1 & 1U) == bVar2) {
            setupColor(this,0.0);
            setupPassSwitch(this,true);
            draw(this,true,iterate::modes[(uint)resulted_value]);
            local_4ec = 1.0;
            if ((iterate::render_cases[k] & 1U) == 0) {
              local_4ec = 0.0;
            }
            local_3c = local_4ec;
            local_40 = readPixel(this);
            fVar7 = de::abs<float>(local_3c - local_40);
            if (0.0078125 < fVar7) {
              pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
              pTVar5 = tcu::TestContext::getLog(pTVar4);
              tcu::TestLog::operator<<
                        (&local_1c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_1c0,
                                  (char (*) [39])"The functional test\'s expected value (");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3c);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,(char (*) [37])") is different than resulted value (");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_40);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,(char (*) [24])"). The tested mode was ");
              local_1c8 = Utilities::modeToChars(iterate::modes[(uint)resulted_value]);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c8);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,(char (*) [29])". Query was done for target ");
              local_1d0 = Utilities::queryTargetToChars(iterate::query_cases[(uint)expected_value]);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d0);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,(char (*) [32])", and the test was prepared to ");
              local_1d8 = "discard";
              if ((iterate::render_cases[k] & 1U) != 0) {
                local_1d8 = "pass";
              }
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d8);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])" all fragments.");
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1c0);
              local_1e = 0;
            }
          }
          else {
            local_1e = 0;
          }
          cleanQueryObject(this);
        }
      }
    }
  }
  cleanProgramViewAndVAO(this);
  if ((local_1e & 1) == 0) {
    if ((local_1f & 1) == 0) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_4d8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_4d8,
                          (char (*) [60])
                          "The Conditional Render Inverted Functional Test has failed.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4d8);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail.");
    }
    else {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_358,
                          (char (*) [79])
                          "Internal error has occured during Conditional Render Inverted Functional Test."
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_358);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Test error.");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::ConditionalRenderInverted::FunctionalTest::iterate()
{
	/* OpenGL support query. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_conditional_render_inverted =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_conditional_render_inverted");

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* This test should only be executed if we're running a GL4.5 context or related extension is available */
	try
	{
		if (is_at_least_gl_45 || is_arb_conditional_render_inverted)
		{
			/* Test cases. */
			static const bool render_cases[] = { false, true };

			static const glw::GLuint render_cases_count = sizeof(render_cases) / sizeof(render_cases[0]);

			static const glw::GLenum query_cases[] = { GL_SAMPLES_PASSED, GL_ANY_SAMPLES_PASSED };

			static const glw::GLuint query_cases_count = sizeof(query_cases) / sizeof(query_cases[0]);

			static const glw::GLenum modes[] = { GL_QUERY_WAIT_INVERTED, GL_QUERY_NO_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_NO_WAIT_INVERTED };

			static const glw::GLuint modes_count = sizeof(modes) / sizeof(modes[0]);

			/* Creating common objects. */
			createProgram();
			createView();
			createVertexArrayObject();

			/* Iterating over test cases. */
			for (glw::GLuint i = 0; i < render_cases_count; ++i)
			{
				for (glw::GLuint j = 0; j < query_cases_count; ++j)
				{
					for (glw::GLuint k = 0; k < modes_count; ++k)
					{
						createQueryObject();

						setupColor(1.f);
						setupPassSwitch(render_cases[i]);
						clearView();
						draw(false, query_cases[j]);

						if (render_cases[i] == fragmentsPassed())
						{
							setupColor(0.f);
							setupPassSwitch(true);
							draw(true, modes[k]);

							glw::GLfloat expected_value = (render_cases[i]) ? 1.f : 0.f;
							glw::GLfloat resulted_value = readPixel();

							if (de::abs(expected_value - resulted_value) > 0.0078125f /* Precission (1/128) */)
							{
								m_context.getTestContext().getLog()
									<< tcu::TestLog::Message << "The functional test's expected value ("
									<< expected_value << ") is different than resulted value (" << resulted_value
									<< "). The tested mode was " << Utilities::modeToChars(modes[k])
									<< ". Query was done for target " << Utilities::queryTargetToChars(query_cases[j])
									<< ", and the test was prepared to " << ((render_cases[i]) ? "pass" : "discard")
									<< " all fragments." << tcu::TestLog::EndMessage;

								is_ok = false;
							}
						}
						else
						{
							is_ok = false;
						}

						cleanQueryObject();
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		cleanQueryObject();
	}

	/* Clean-up. */
	cleanProgramViewAndVAO();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Internal error has occured during Conditional Render Inverted Functional Test."
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Test error.");
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "The Conditional Render Inverted Functional Test has failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail.");
		}
	}

	return STOP;
}